

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackExternalGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteToJSON
          (cmCPackExternalVersionGenerator *this,Value *root)

{
  cmCPackExternalGenerator *pcVar1;
  pointer pcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  cmValue cVar7;
  Value *pVVar8;
  string *value;
  Value *pVVar9;
  Value *pVVar10;
  _Base_ptr p_Var11;
  cmCPackInstallationType **installationType_1;
  _Base_ptr p_Var12;
  cmCPackInstallationType **installationType;
  pointer ppcVar13;
  pointer ppcVar14;
  cmCPackComponent **dep;
  pointer value_00;
  allocator<char> local_a9;
  Value jsonProject;
  Value local_78;
  Value *local_50;
  cmCPackExternalVersionGenerator *local_48;
  Value *local_40;
  Value *local_38;
  
  WriteVersion(this,root);
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&jsonProject,"CPACK_PACKAGE_NAME",(allocator<char> *)&local_78);
  cVar7 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&jsonProject);
  std::__cxx11::string::~string((string *)&jsonProject);
  if (cVar7.Value != (string *)0x0) {
    Json::Value::Value(&jsonProject,cVar7.Value);
    pVVar8 = Json::Value::operator[](root,"packageName");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&jsonProject,"CPACK_PACKAGE_VERSION",(allocator<char> *)&local_78);
  cVar7 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&jsonProject);
  std::__cxx11::string::~string((string *)&jsonProject);
  if (cVar7.Value != (string *)0x0) {
    Json::Value::Value(&jsonProject,cVar7.Value);
    pVVar8 = Json::Value::operator[](root,"packageVersion");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&jsonProject,"CPACK_PACKAGE_DESCRIPTION_FILE",(allocator<char> *)&local_78);
  cVar7 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&jsonProject);
  std::__cxx11::string::~string((string *)&jsonProject);
  if (cVar7.Value != (string *)0x0) {
    Json::Value::Value(&jsonProject,cVar7.Value);
    pVVar8 = Json::Value::operator[](root,"packageDescriptionFile");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&jsonProject,"CPACK_PACKAGE_DESCRIPTION_SUMMARY",(allocator<char> *)&local_78
            );
  cVar7 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&jsonProject);
  std::__cxx11::string::~string((string *)&jsonProject);
  if (cVar7.Value != (string *)0x0) {
    Json::Value::Value(&jsonProject,cVar7.Value);
    pVVar8 = Json::Value::operator[](root,"packageDescriptionSummary");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&jsonProject,"CPACK_BUILD_CONFIG",(allocator<char> *)&local_78);
  cVar7 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&jsonProject);
  std::__cxx11::string::~string((string *)&jsonProject);
  if (cVar7.Value != (string *)0x0) {
    Json::Value::Value(&jsonProject,cVar7.Value);
    pVVar8 = Json::Value::operator[](root,"buildConfig");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&jsonProject,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
             (allocator<char> *)&local_78);
  cVar7 = cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&jsonProject);
  std::__cxx11::string::~string((string *)&jsonProject);
  if ((cVar7.Value != (string *)0x0) && ((cVar7.Value)->_M_string_length != 0)) {
    Json::Value::Value(&jsonProject,cVar7.Value);
    pVVar8 = Json::Value::operator[](root,"defaultDirectoryPermissions");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&jsonProject,"CPACK_SET_DESTDIR",(allocator<char> *)&local_78);
  cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&jsonProject);
  bVar6 = cmIsInternallyOn((cmValue)0x183096);
  std::__cxx11::string::~string((string *)&jsonProject);
  if (bVar6) {
    Json::Value::Value(&jsonProject,true);
    pVVar8 = Json::Value::operator[](root,"setDestdir");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
    pcVar1 = this->Parent;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CPACK_PACKAGING_INSTALL_PREFIX",&local_a9);
    value = (string *)
            cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&local_78);
    if (value == (string *)0x0) {
      value = &cmValue::Empty_abi_cxx11_;
    }
    Json::Value::Value(&jsonProject,value);
    pVVar8 = Json::Value::operator[](root,"packagingInstallPrefix");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    Json::Value::Value(&jsonProject,false);
    pVVar8 = Json::Value::operator[](root,"setDestdir");
    Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CPACK_STRIP_FILES",&local_a9);
  cmCPackGenerator::GetOption(&pcVar1->super_cmCPackGenerator,(string *)&local_78);
  bVar6 = cmIsOff((cmValue)0x1831ae);
  Json::Value::Value(&jsonProject,!bVar6);
  pVVar8 = Json::Value::operator[](root,"stripFiles");
  Json::Value::operator=(pVVar8,&jsonProject);
  Json::Value::~Value(&jsonProject);
  std::__cxx11::string::~string((string *)&local_78);
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION",&local_a9);
  bVar6 = cmCPackGenerator::IsOn(&pcVar1->super_cmCPackGenerator,(string *)&local_78);
  Json::Value::Value(&jsonProject,bVar6);
  pVVar8 = Json::Value::operator[](root,"warnOnAbsoluteInstallDestination");
  Json::Value::operator=(pVVar8,&jsonProject);
  Json::Value::~Value(&jsonProject);
  std::__cxx11::string::~string((string *)&local_78);
  pcVar1 = this->Parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION",&local_a9);
  bVar6 = cmCPackGenerator::IsOn(&pcVar1->super_cmCPackGenerator,(string *)&local_78);
  Json::Value::Value(&jsonProject,bVar6);
  pVVar8 = Json::Value::operator[](root,"errorOnAbsoluteInstallDestination");
  Json::Value::operator=(pVVar8,&jsonProject);
  Json::Value::~Value(&jsonProject);
  std::__cxx11::string::~string((string *)&local_78);
  Json::Value::Value(&jsonProject,arrayValue);
  local_40 = root;
  pVVar8 = Json::Value::operator[](root,"projects");
  local_50 = Json::Value::operator=(pVVar8,&jsonProject);
  Json::Value::~Value(&jsonProject);
  pcVar2 = (this->Parent->super_cmCPackGenerator).CMakeProjects.
           super__Vector_base<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  for (value_00 = (this->Parent->super_cmCPackGenerator).CMakeProjects.
                  super__Vector_base<cmCPackInstallCMakeProject,_std::allocator<cmCPackInstallCMakeProject>_>
                  ._M_impl.super__Vector_impl_data._M_start; value_00 != pcVar2;
      value_00 = value_00 + 1) {
    Json::Value::Value(&jsonProject,objectValue);
    Json::Value::Value(&local_78,&value_00->ProjectName);
    pVVar8 = Json::Value::operator[](&jsonProject,"projectName");
    Json::Value::operator=(pVVar8,&local_78);
    Json::Value::~Value(&local_78);
    Json::Value::Value(&local_78,&value_00->Component);
    pVVar8 = Json::Value::operator[](&jsonProject,"component");
    Json::Value::operator=(pVVar8,&local_78);
    Json::Value::~Value(&local_78);
    Json::Value::Value(&local_78,&value_00->Directory);
    pVVar8 = Json::Value::operator[](&jsonProject,"directory");
    Json::Value::operator=(pVVar8,&local_78);
    Json::Value::~Value(&local_78);
    Json::Value::Value(&local_78,&value_00->SubDirectory);
    pVVar8 = Json::Value::operator[](&jsonProject,"subDirectory");
    Json::Value::operator=(pVVar8,&local_78);
    Json::Value::~Value(&local_78);
    Json::Value::Value(&local_78,arrayValue);
    pVVar8 = Json::Value::operator[](&jsonProject,"installationTypes");
    pVVar8 = Json::Value::operator=(pVVar8,&local_78);
    Json::Value::~Value(&local_78);
    ppcVar3 = (value_00->InstallationTypes).
              super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppcVar13 = (value_00->InstallationTypes).
                    super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar3;
        ppcVar13 = ppcVar13 + 1) {
      Json::Value::Value(&local_78,&(*ppcVar13)->Name);
      Json::Value::append(pVVar8,&local_78);
      Json::Value::~Value(&local_78);
    }
    Json::Value::Value(&local_78,arrayValue);
    pVVar8 = Json::Value::operator[](&jsonProject,"components");
    pVVar8 = Json::Value::operator=(pVVar8,&local_78);
    Json::Value::~Value(&local_78);
    ppcVar4 = (value_00->Components).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar14 = (value_00->Components).
                    super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppcVar14 != ppcVar4;
        ppcVar14 = ppcVar14 + 1) {
      Json::Value::Value(&local_78,&(*ppcVar14)->Name);
      Json::Value::append(pVVar8,&local_78);
      Json::Value::~Value(&local_78);
    }
    Json::Value::append(local_50,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  Json::Value::Value(&jsonProject,objectValue);
  pVVar8 = Json::Value::operator[](local_40,"installationTypes");
  pVVar8 = Json::Value::operator=(pVVar8,&jsonProject);
  Json::Value::~Value(&jsonProject);
  pcVar1 = local_48->Parent;
  for (p_Var11 = (pcVar1->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                 super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var11 !=
      &(pcVar1->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    Json::Value::Value(&jsonProject,objectValue);
    pVVar9 = Json::Value::operator[](pVVar8,(String *)(p_Var11 + 1));
    pVVar9 = Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)(p_Var11 + 2));
    pVVar10 = Json::Value::operator[](pVVar9,"name");
    Json::Value::operator=(pVVar10,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)(p_Var11 + 3));
    pVVar10 = Json::Value::operator[](pVVar9,"displayName");
    Json::Value::operator=(pVVar10,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,p_Var11[4]._M_color);
    pVVar9 = Json::Value::operator[](pVVar9,"index");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
  }
  Json::Value::Value(&jsonProject,objectValue);
  pVVar8 = Json::Value::operator[](local_40,"components");
  local_38 = Json::Value::operator=(pVVar8,&jsonProject);
  Json::Value::~Value(&jsonProject);
  local_50 = (Value *)&(local_48->Parent->super_cmCPackGenerator).Components._M_t._M_impl.
                       super__Rb_tree_header;
  for (p_Var11 = (local_48->Parent->super_cmCPackGenerator).Components._M_t._M_impl.
                 super__Rb_tree_header._M_header._M_left; (Value *)p_Var11 != local_50;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    Json::Value::Value(&jsonProject,objectValue);
    pVVar8 = Json::Value::operator[](local_38,(String *)(p_Var11 + 1));
    pVVar8 = Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)(p_Var11 + 2));
    pVVar9 = Json::Value::operator[](pVVar8,"name");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)(p_Var11 + 3));
    pVVar9 = Json::Value::operator[](pVVar8,"displayName");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    if (*(String **)(p_Var11 + 4) != (String *)0x0) {
      Json::Value::Value(&jsonProject,*(String **)(p_Var11 + 4));
      pVVar9 = Json::Value::operator[](pVVar8,"group");
      Json::Value::operator=(pVVar9,&jsonProject);
      Json::Value::~Value(&jsonProject);
    }
    Json::Value::Value(&jsonProject,(bool)(*(byte *)&p_Var11[4]._M_parent & 1));
    pVVar9 = Json::Value::operator[](pVVar8,"isRequired");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(bool)((*(byte *)&p_Var11[4]._M_parent & 2) >> 1));
    pVVar9 = Json::Value::operator[](pVVar8,"isHidden");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(bool)((*(byte *)&p_Var11[4]._M_parent & 4) >> 2));
    pVVar9 = Json::Value::operator[](pVVar8,"isDisabledByDefault");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(bool)((*(byte *)&p_Var11[4]._M_parent & 8) >> 3));
    pVVar9 = Json::Value::operator[](pVVar8,"isDownloaded");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)&p_Var11[4]._M_left);
    pVVar9 = Json::Value::operator[](pVVar8,"description");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)&p_Var11[6]._M_parent);
    pVVar9 = Json::Value::operator[](pVVar8,"archiveFile");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,arrayValue);
    pVVar9 = Json::Value::operator[](pVVar8,"installationTypes");
    pVVar9 = Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    p_Var5 = p_Var11[5]._M_right;
    for (p_Var12 = p_Var11[5]._M_left; p_Var12 != p_Var5; p_Var12 = (_Base_ptr)&p_Var12->_M_parent)
    {
      Json::Value::Value(&jsonProject,*(String **)p_Var12);
      Json::Value::append(pVVar9,&jsonProject);
      Json::Value::~Value(&jsonProject);
    }
    Json::Value::Value(&jsonProject,arrayValue);
    pVVar8 = Json::Value::operator[](pVVar8,"dependencies");
    pVVar8 = Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
    p_Var5 = p_Var11[8]._M_left;
    for (p_Var12 = p_Var11[8]._M_parent; p_Var12 != p_Var5; p_Var12 = (_Base_ptr)&p_Var12->_M_parent
        ) {
      Json::Value::Value(&jsonProject,*(String **)p_Var12);
      Json::Value::append(pVVar8,&jsonProject);
      Json::Value::~Value(&jsonProject);
    }
  }
  Json::Value::Value(&jsonProject,objectValue);
  pVVar8 = Json::Value::operator[](local_40,"componentGroups");
  local_38 = Json::Value::operator=(pVVar8,&jsonProject);
  Json::Value::~Value(&jsonProject);
  local_50 = (Value *)&(local_48->Parent->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                       super__Rb_tree_header;
  for (p_Var11 = (local_48->Parent->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                 super__Rb_tree_header._M_header._M_left; (Value *)p_Var11 != local_50;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    Json::Value::Value(&jsonProject,objectValue);
    pVVar8 = Json::Value::operator[](local_38,(String *)(p_Var11 + 1));
    pVVar8 = Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)(p_Var11 + 2));
    pVVar9 = Json::Value::operator[](pVVar8,"name");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)(p_Var11 + 3));
    pVVar9 = Json::Value::operator[](pVVar8,"displayName");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(String *)(p_Var11 + 4));
    pVVar9 = Json::Value::operator[](pVVar8,"description");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(bool)((char)p_Var11[5]._M_color & _S_black));
    pVVar9 = Json::Value::operator[](pVVar8,"isBold");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    Json::Value::Value(&jsonProject,(bool)((byte)((char)p_Var11[5]._M_color & 2) >> 1));
    pVVar9 = Json::Value::operator[](pVVar8,"isExpandedByDefault");
    Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    if (*(String **)(p_Var11 + 6) != (String *)0x0) {
      Json::Value::Value(&jsonProject,*(String **)(p_Var11 + 6));
      pVVar9 = Json::Value::operator[](pVVar8,"parentGroup");
      Json::Value::operator=(pVVar9,&jsonProject);
      Json::Value::~Value(&jsonProject);
    }
    Json::Value::Value(&jsonProject,arrayValue);
    pVVar9 = Json::Value::operator[](pVVar8,"subgroups");
    pVVar9 = Json::Value::operator=(pVVar9,&jsonProject);
    Json::Value::~Value(&jsonProject);
    p_Var5 = p_Var11[6]._M_left;
    for (p_Var12 = p_Var11[6]._M_parent; p_Var12 != p_Var5; p_Var12 = (_Base_ptr)&p_Var12->_M_parent
        ) {
      Json::Value::Value(&jsonProject,*(String **)p_Var12);
      Json::Value::append(pVVar9,&jsonProject);
      Json::Value::~Value(&jsonProject);
    }
    Json::Value::Value(&jsonProject,arrayValue);
    pVVar8 = Json::Value::operator[](pVVar8,"components");
    pVVar8 = Json::Value::operator=(pVVar8,&jsonProject);
    Json::Value::~Value(&jsonProject);
    p_Var5 = p_Var11[5]._M_left;
    for (p_Var12 = p_Var11[5]._M_parent; p_Var12 != p_Var5; p_Var12 = (_Base_ptr)&p_Var12->_M_parent
        ) {
      Json::Value::Value(&jsonProject,*(String **)p_Var12);
      Json::Value::append(pVVar8,&jsonProject);
      Json::Value::~Value(&jsonProject);
    }
  }
  return 1;
}

Assistant:

int cmCPackExternalGenerator::cmCPackExternalVersionGenerator::WriteToJSON(
  Json::Value& root)
{
  if (!this->WriteVersion(root)) {
    return 0;
  }

  cmValue packageName = this->Parent->GetOption("CPACK_PACKAGE_NAME");
  if (packageName) {
    root["packageName"] = *packageName;
  }

  cmValue packageVersion = this->Parent->GetOption("CPACK_PACKAGE_VERSION");
  if (packageVersion) {
    root["packageVersion"] = *packageVersion;
  }

  cmValue packageDescriptionFile =
    this->Parent->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if (packageDescriptionFile) {
    root["packageDescriptionFile"] = *packageDescriptionFile;
  }

  cmValue packageDescriptionSummary =
    this->Parent->GetOption("CPACK_PACKAGE_DESCRIPTION_SUMMARY");
  if (packageDescriptionSummary) {
    root["packageDescriptionSummary"] = *packageDescriptionSummary;
  }

  cmValue buildConfigCstr = this->Parent->GetOption("CPACK_BUILD_CONFIG");
  if (buildConfigCstr) {
    root["buildConfig"] = *buildConfigCstr;
  }

  cmValue defaultDirectoryPermissions =
    this->Parent->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (cmNonempty(defaultDirectoryPermissions)) {
    root["defaultDirectoryPermissions"] = *defaultDirectoryPermissions;
  }
  if (cmIsInternallyOn(this->Parent->GetOption("CPACK_SET_DESTDIR"))) {
    root["setDestdir"] = true;
    root["packagingInstallPrefix"] =
      *this->Parent->GetOption("CPACK_PACKAGING_INSTALL_PREFIX");
  } else {
    root["setDestdir"] = false;
  }

  root["stripFiles"] = !cmIsOff(this->Parent->GetOption("CPACK_STRIP_FILES"));
  root["warnOnAbsoluteInstallDestination"] =
    this->Parent->IsOn("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION");
  root["errorOnAbsoluteInstallDestination"] =
    this->Parent->IsOn("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION");

  Json::Value& projects = root["projects"] = Json::Value(Json::arrayValue);
  for (auto& project : this->Parent->CMakeProjects) {
    Json::Value jsonProject(Json::objectValue);

    jsonProject["projectName"] = project.ProjectName;
    jsonProject["component"] = project.Component;
    jsonProject["directory"] = project.Directory;
    jsonProject["subDirectory"] = project.SubDirectory;

    Json::Value& installationTypes = jsonProject["installationTypes"] =
      Json::Value(Json::arrayValue);
    for (auto& installationType : project.InstallationTypes) {
      installationTypes.append(installationType->Name);
    }

    Json::Value& components = jsonProject["components"] =
      Json::Value(Json::arrayValue);
    for (auto& component : project.Components) {
      components.append(component->Name);
    }

    projects.append(jsonProject);
  }

  Json::Value& installationTypes = root["installationTypes"] =
    Json::Value(Json::objectValue);
  for (auto& installationType : this->Parent->InstallationTypes) {
    Json::Value& jsonInstallationType =
      installationTypes[installationType.first] =
        Json::Value(Json::objectValue);

    jsonInstallationType["name"] = installationType.second.Name;
    jsonInstallationType["displayName"] = installationType.second.DisplayName;
    jsonInstallationType["index"] = installationType.second.Index;
  }

  Json::Value& components = root["components"] =
    Json::Value(Json::objectValue);
  for (auto& component : this->Parent->Components) {
    Json::Value& jsonComponent = components[component.first] =
      Json::Value(Json::objectValue);

    jsonComponent["name"] = component.second.Name;
    jsonComponent["displayName"] = component.second.DisplayName;
    if (component.second.Group) {
      jsonComponent["group"] = component.second.Group->Name;
    }
    jsonComponent["isRequired"] = component.second.IsRequired;
    jsonComponent["isHidden"] = component.second.IsHidden;
    jsonComponent["isDisabledByDefault"] =
      component.second.IsDisabledByDefault;
    jsonComponent["isDownloaded"] = component.second.IsDownloaded;
    jsonComponent["description"] = component.second.Description;
    jsonComponent["archiveFile"] = component.second.ArchiveFile;

    Json::Value& cmpInstallationTypes = jsonComponent["installationTypes"] =
      Json::Value(Json::arrayValue);
    for (auto& installationType : component.second.InstallationTypes) {
      cmpInstallationTypes.append(installationType->Name);
    }

    Json::Value& dependencies = jsonComponent["dependencies"] =
      Json::Value(Json::arrayValue);
    for (auto& dep : component.second.Dependencies) {
      dependencies.append(dep->Name);
    }
  }

  Json::Value& groups = root["componentGroups"] =
    Json::Value(Json::objectValue);
  for (auto& group : this->Parent->ComponentGroups) {
    Json::Value& jsonGroup = groups[group.first] =
      Json::Value(Json::objectValue);

    jsonGroup["name"] = group.second.Name;
    jsonGroup["displayName"] = group.second.DisplayName;
    jsonGroup["description"] = group.second.Description;
    jsonGroup["isBold"] = group.second.IsBold;
    jsonGroup["isExpandedByDefault"] = group.second.IsExpandedByDefault;
    if (group.second.ParentGroup) {
      jsonGroup["parentGroup"] = group.second.ParentGroup->Name;
    }

    Json::Value& subgroups = jsonGroup["subgroups"] =
      Json::Value(Json::arrayValue);
    for (auto& subgroup : group.second.Subgroups) {
      subgroups.append(subgroup->Name);
    }

    Json::Value& groupComponents = jsonGroup["components"] =
      Json::Value(Json::arrayValue);
    for (auto& component : group.second.Components) {
      groupComponents.append(component->Name);
    }
  }

  return 1;
}